

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  uint uVar1;
  sqlite3_vtab *psVar2;
  size_t sVar3;
  int *piVar4;
  sqlite3_value **aReplace;
  ulong uVar5;
  JsonNode *pNode;
  Mem *pMem;
  JsonString x;
  JsonString local_a8;
  
  if (8 < (uint)i) {
LAB_001d128e:
    psVar2 = (sqlite3_vtab *)"$";
    if (cur[5].pVtab != (sqlite3_vtab *)0x0) {
      psVar2 = cur[5].pVtab;
    }
    goto LAB_001d1376;
  }
  uVar1 = *(uint *)&cur[2].pVtab;
  aReplace = (sqlite3_value **)(ulong)uVar1;
  pNode = (JsonNode *)(&(cur[7].pVtab)->pModule + (long)aReplace * 2);
  local_a8.pCtx = ctx;
  switch(i) {
  case 0:
    if (aReplace == (sqlite3_value **)0x0) {
      return 0;
    }
    if (*(char *)&cur[3].pVtab != '\x06') {
      if (*(char *)&cur[3].pVtab != '\a') {
        return 0;
      }
      goto LAB_001d12b3;
    }
    piVar4 = (int *)(cur + 1);
    if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
      if (*piVar4 == 0) {
        return 0;
      }
      piVar4 = &(cur[7].pVtab)->nRef +
               (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + (long)aReplace * 4) * 4;
    }
    uVar1 = *piVar4;
    break;
  case 1:
    pNode = (JsonNode *)((long)&pNode->eType + (ulong)(pNode->jnFlags >> 2 & 0x10));
    goto LAB_001d12b3;
  case 2:
    psVar2 = (sqlite3_vtab *)
             jsonType[*(byte *)((long)&pNode->eType + (ulong)(pNode->jnFlags >> 2 & 0x10))];
    goto LAB_001d1376;
  case 3:
    uVar5 = (ulong)(pNode->jnFlags >> 2 & 0x10);
    if (5 < *(byte *)((long)&pNode->eType + uVar5)) {
      return 0;
    }
    pNode = (JsonNode *)((long)&pNode->eType + uVar5);
LAB_001d12b3:
    jsonReturn(pNode,ctx,aReplace);
    return 0;
  case 4:
    uVar5 = (long)aReplace + (ulong)((pNode->jnFlags >> 6 & 1) != 0);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      (pMem->u).i = uVar5;
      goto LAB_001d13ee;
    }
    goto LAB_001d13e4;
  case 5:
    if (uVar1 <= *(uint *)((long)&cur[1].pVtab + 4)) {
      return 0;
    }
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      return 0;
    }
    uVar1 = *(uint *)((long)&(cur[9].pVtab)->pModule + (long)aReplace * 4);
    break;
  case 6:
    local_a8.zBuf = local_a8.zSpace;
    local_a8.nAlloc = 100;
    local_a8.nUsed = 0;
    local_a8.bStatic = '\x01';
    local_a8.bErr = '\0';
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      psVar2 = cur[5].pVtab;
      if (psVar2 == (sqlite3_vtab *)0x0) {
        jsonAppendChar(&local_a8,'$');
      }
      else {
        sVar3 = strlen((char *)psVar2);
        jsonAppendRaw(&local_a8,(char *)psVar2,(u32)sVar3);
      }
      if (*(char *)&cur[3].pVtab == '\a') {
        jsonPrintf(pNode->n,&local_a8,".%.*s",(ulong)(pNode->n - 2),&((pNode->u).pPatch)->jnFlags);
      }
      else if (*(char *)&cur[3].pVtab == '\x06') {
        jsonPrintf(0x1e,&local_a8,"[%d]",(ulong)*(uint *)&cur[1].pVtab);
      }
    }
    else {
      jsonEachComputePath((JsonEachCursor *)cur,&local_a8,uVar1);
    }
    if (local_a8.bErr != '\0') {
      return 0;
    }
    sqlite3_result_text64
              (local_a8.pCtx,local_a8.zBuf,local_a8.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_a8.bStatic != '\0') | 0x11ccb0),'\x01');
    return 0;
  case 7:
    if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
      local_a8.zBuf = local_a8.zSpace;
      local_a8.nAlloc = 100;
      local_a8.nUsed = 0;
      local_a8.bStatic = '\x01';
      local_a8.bErr = '\0';
      jsonEachComputePath((JsonEachCursor *)cur,&local_a8,
                          *(u32 *)((long)&(cur[9].pVtab)->pModule + (long)aReplace * 4));
      if (local_a8.bErr != '\0') {
        return 0;
      }
      sqlite3_result_text64
                (local_a8.pCtx,local_a8.zBuf,local_a8.nUsed,
                 (_func_void_void_ptr *)(-(ulong)(local_a8.bStatic != '\0') | 0x11ccb0),'\x01');
      return 0;
    }
    goto LAB_001d128e;
  case 8:
    psVar2 = cur[8].pVtab;
LAB_001d1376:
    setResultStrOrError(ctx,(char *)psVar2,-1,'\x01',(_func_void_void_ptr *)0x0);
    return 0;
  }
  uVar5 = (ulong)uVar1;
  pMem = ctx->pOut;
  if ((pMem->flags & 0x2400) == 0) {
    (pMem->u).i = uVar5;
LAB_001d13ee:
    pMem->flags = 4;
    return 0;
  }
LAB_001d13e4:
  vdbeReleaseAndSetInt64(pMem,uVar5);
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int i                       /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  JsonNode *pThis = &p->sParse.aNode[p->i];
  switch( i ){
    case JEACH_KEY: {
      if( p->i==0 ) break;
      if( p->eType==JSON_OBJECT ){
        jsonReturn(pThis, ctx, 0);
      }else if( p->eType==JSON_ARRAY ){
        u32 iKey;
        if( p->bRecursive ){
          if( p->iRowid==0 ) break;
          iKey = p->sParse.aNode[p->sParse.aUp[p->i]].u.iKey;
        }else{
          iKey = p->iRowid;
        }
        sqlite3_result_int64(ctx, (sqlite3_int64)iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_TYPE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      sqlite3_result_text(ctx, jsonType[pThis->eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      if( pThis->eType>=JSON_ARRAY ) break;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, 
         (sqlite3_int64)p->i + ((pThis->jnFlags & JNODE_LABEL)!=0));
      break;
    }
    case JEACH_PARENT: {
      if( p->i>p->iBegin && p->bRecursive ){
        sqlite3_result_int64(ctx, (sqlite3_int64)p->sParse.aUp[p->i]);
      }
      break;
    }
    case JEACH_FULLKEY: {
      JsonString x;
      jsonInit(&x, ctx);
      if( p->bRecursive ){
        jsonEachComputePath(p, &x, p->i);
      }else{
        if( p->zRoot ){
          jsonAppendRaw(&x, p->zRoot, (int)strlen(p->zRoot));
        }else{
          jsonAppendChar(&x, '$');
        }
        if( p->eType==JSON_ARRAY ){
          jsonPrintf(30, &x, "[%d]", p->iRowid);
        }else if( p->eType==JSON_OBJECT ){
          jsonPrintf(pThis->n, &x, ".%.*s", pThis->n-2, pThis->u.zJContent+1);
        }
      }
      jsonResult(&x);
      break;
    }
    case JEACH_PATH: {
      if( p->bRecursive ){
        JsonString x;
        jsonInit(&x, ctx);
        jsonEachComputePath(p, &x, p->sParse.aUp[p->i]);
        jsonResult(&x);
        break;
      }
      /* For json_each() path and root are the same so fall through
      ** into the root case */
    }
    default: {
      const char *zRoot = p->zRoot;
      if( zRoot==0 ) zRoot = "$";
      sqlite3_result_text(ctx, zRoot, -1, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      assert( i==JEACH_JSON );
      sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_STATIC);
      break;
    }
  }
  return SQLITE_OK;
}